

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall cmComputeTargetDepends::DisplaySideEffects(cmComputeTargetDepends *this)

{
  pointer pTVar1;
  mapped_type_conflict1 mVar2;
  FILE *pFVar3;
  cmComputeTargetDepends *pcVar4;
  long lVar5;
  string *psVar6;
  mapped_type_conflict1 *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  cmGeneratorTarget *gt;
  FILE *local_58;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  *local_50;
  long local_48;
  cmComputeTargetDepends *local_40;
  long local_38;
  
  fwrite("The side effects are:\n",0x16,1,_stderr);
  lVar5 = (long)(this->SideEffects).
                super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->SideEffects).
                super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    lVar5 = lVar5 / 0x60;
    local_50 = &this->TargetIndex;
    local_48 = lVar5 + (ulong)(lVar5 == 0);
    lVar5 = 0;
    local_40 = this;
    do {
      pcVar4 = local_40;
      pFVar3 = _stderr;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((local_40->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar5]);
      fprintf(pFVar3,"target %zu is [%s]\n",lVar5,(psVar6->_M_dataplus)._M_p);
      local_38 = lVar5;
      if (*(size_t *)
           ((long)&(pcVar4->SideEffects).
                   super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar5].CustomCommandSideEffects._M_t.
                   _M_impl + 0x28) != 0) {
        fwrite("  custom commands\n",0x12,1,_stderr);
        pTVar1 = (pcVar4->SideEffects).
                 super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (p_Var9 = *(_Base_ptr *)
                       ((long)&pTVar1[lVar5].CustomCommandSideEffects._M_t._M_impl + 0x18);
            p_Var9 != (_Rb_tree_node_base *)
                      ((long)&pTVar1[lVar5].CustomCommandSideEffects._M_t._M_impl + 8U);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          gt = *(cmGeneratorTarget **)(p_Var9 + 1);
          local_58 = _stderr;
          pmVar7 = std::
                   map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   ::operator[](local_50,&gt);
          mVar2 = *pmVar7;
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
          fprintf(local_58,"    from target %zu [%s]\n",mVar2,(psVar6->_M_dataplus)._M_p);
        }
      }
      pTVar1 = (pcVar4->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_58 = (FILE *)((long)&pTVar1[lVar5].LanguageSideEffects._M_t._M_impl + 8);
      p_Var9 = *(_Base_ptr *)((long)&pTVar1[lVar5].LanguageSideEffects._M_t._M_impl + 0x18);
      if ((FILE *)p_Var9 != local_58) {
        do {
          fprintf(_stderr,"  language %s\n",*(undefined8 *)(p_Var9 + 1));
          p_Var8 = p_Var9[2]._M_right;
          pFVar3 = _stderr;
          while (_stderr = pFVar3, p_Var8 != (_Rb_tree_node_base *)&p_Var9[2]._M_parent) {
            gt = *(cmGeneratorTarget **)(p_Var8 + 1);
            pmVar7 = std::
                     map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                     ::operator[](local_50,&gt);
            mVar2 = *pmVar7;
            psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
            fprintf(pFVar3,"    from target %zu [%s]\n",mVar2,(psVar6->_M_dataplus)._M_p);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
            pFVar3 = _stderr;
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((FILE *)p_Var9 != local_58);
      }
      lVar5 = local_38 + 1;
    } while (lVar5 != local_48);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplaySideEffects()
{
  fprintf(stderr, "The side effects are:\n");
  size_t n = this->SideEffects.size();
  for (size_t depender_index = 0; depender_index < n; ++depender_index) {
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %zu is [%s]\n", depender_index,
            depender->GetName().c_str());
    if (!this->SideEffects[depender_index].CustomCommandSideEffects.empty()) {
      fprintf(stderr, "  custom commands\n");
      for (auto const* gt :
           this->SideEffects[depender_index].CustomCommandSideEffects) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
    for (auto const& it :
         this->SideEffects[depender_index].LanguageSideEffects) {
      fprintf(stderr, "  language %s\n", it.first.c_str());
      for (auto const* gt : it.second) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
  }
  fprintf(stderr, "\n");
}